

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

RootNode * __thiscall Fl_Preferences::Node::findRoot(Node *this)

{
  undefined1 *puVar1;
  Node *n;
  
  do {
    puVar1 = &this->field_0x30;
    this = (this->field_2).parent_;
    if ((*puVar1 & 2) != 0) {
      return (RootNode *)this;
    }
  } while (this != (Node *)0x0);
  return (RootNode *)0x0;
}

Assistant:

Fl_Preferences::RootNode *Fl_Preferences::Node::findRoot() {
  Node *n = this;
  do {
    if (n->top_)
      return n->root_;
    n = n->parent();
  } while (n);
  return 0L;
}